

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O3

void __thiscall QDockWidgetPrivate::setResizerActive(QDockWidgetPrivate *this,bool active)

{
  uint uVar1;
  QWidget *parent;
  bool bVar2;
  long lVar3;
  QWidgetResizeHandler *this_00;
  
  parent = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  lVar3 = QMetaObject::cast((QObject *)&QDockWidgetLayout::staticMetaObject);
  uVar1 = (parent->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
          super_QFlagsStorage<Qt::WindowType>.i;
  bVar2 = QDockWidgetLayout::wmSupportsNativeWindowDeco();
  if (((bVar2) && ((uVar1 & 1) != 0)) && (*(long *)(*(long *)(lVar3 + 0x28) + 0x18) == 0)) {
    return;
  }
  this_00 = this->resizer;
  if (active) {
    if (this_00 == (QWidgetResizeHandler *)0x0) {
      this_00 = (QWidgetResizeHandler *)operator_new(0x48);
      QWidgetResizeHandler::QWidgetResizeHandler
                ((QWidgetResizeHandler *)this_00,parent,(QWidget *)0x0);
      this->resizer = this_00;
    }
  }
  else if (this_00 == (QWidgetResizeHandler *)0x0) {
    return;
  }
  QWidgetResizeHandler::setEnabled((QWidgetResizeHandler *)this_00,active);
  return;
}

Assistant:

void QDockWidgetPrivate::setResizerActive(bool active)
{
    Q_Q(QDockWidget);
    const auto *dwLayout = qobject_cast<QDockWidgetLayout *>(layout);
    if (dwLayout->nativeWindowDeco(q->isFloating()))
        return;

    if (active && !resizer)
        resizer = new QWidgetResizeHandler(q);
    if (resizer)
        resizer->setEnabled(active);
}